

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O1

char * __thiscall deqp::sl::ShaderParser::getTokenName(ShaderParser *this,Token token)

{
  if (token < TOKEN_LAST) {
    return &DAT_01bc0560 + *(int *)(&DAT_01bc0560 + (ulong)token * 4);
  }
  return "<unknown>";
}

Assistant:

const char* ShaderParser::getTokenName(Token token)
{
	switch (token)
	{
	case TOKEN_INVALID:
		return "<invalid>";
	case TOKEN_EOF:
		return "<eof>";
	case TOKEN_STRING:
		return "<string>";
	case TOKEN_SHADER_SOURCE:
		return "source";

	case TOKEN_INT_LITERAL:
		return "<int>";
	case TOKEN_FLOAT_LITERAL:
		return "<float>";

	// identifiers
	case TOKEN_IDENTIFIER:
		return "<identifier>";
	case TOKEN_TRUE:
		return "true";
	case TOKEN_FALSE:
		return "false";
	case TOKEN_DESC:
		return "desc";
	case TOKEN_EXPECT:
		return "expect";
	case TOKEN_GROUP:
		return "group";
	case TOKEN_CASE:
		return "case";
	case TOKEN_END:
		return "end";
	case TOKEN_VALUES:
		return "values";
	case TOKEN_BOTH:
		return "both";
	case TOKEN_VERTEX:
		return "vertex";
	case TOKEN_FRAGMENT:
		return "fragment";
	case TOKEN_UNIFORM:
		return "uniform";
	case TOKEN_INPUT:
		return "input";
	case TOKEN_OUTPUT:
		return "output";
	case TOKEN_FLOAT:
		return "float";
	case TOKEN_FLOAT_VEC2:
		return "vec2";
	case TOKEN_FLOAT_VEC3:
		return "vec3";
	case TOKEN_FLOAT_VEC4:
		return "vec4";
	case TOKEN_FLOAT_MAT2:
		return "mat2";
	case TOKEN_FLOAT_MAT2X3:
		return "mat2x3";
	case TOKEN_FLOAT_MAT2X4:
		return "mat2x4";
	case TOKEN_FLOAT_MAT3X2:
		return "mat3x2";
	case TOKEN_FLOAT_MAT3:
		return "mat3";
	case TOKEN_FLOAT_MAT3X4:
		return "mat3x4";
	case TOKEN_FLOAT_MAT4X2:
		return "mat4x2";
	case TOKEN_FLOAT_MAT4X3:
		return "mat4x3";
	case TOKEN_FLOAT_MAT4:
		return "mat4";
	case TOKEN_INT:
		return "int";
	case TOKEN_INT_VEC2:
		return "ivec2";
	case TOKEN_INT_VEC3:
		return "ivec3";
	case TOKEN_INT_VEC4:
		return "ivec4";
	case TOKEN_UINT:
		return "uint";
	case TOKEN_UINT_VEC2:
		return "uvec2";
	case TOKEN_UINT_VEC3:
		return "uvec3";
	case TOKEN_UINT_VEC4:
		return "uvec4";
	case TOKEN_BOOL:
		return "bool";
	case TOKEN_BOOL_VEC2:
		return "bvec2";
	case TOKEN_BOOL_VEC3:
		return "bvec3";
	case TOKEN_BOOL_VEC4:
		return "bvec4";

	case TOKEN_ASSIGN:
		return "=";
	case TOKEN_PLUS:
		return "+";
	case TOKEN_MINUS:
		return "-";
	case TOKEN_COMMA:
		return ",";
	case TOKEN_VERTICAL_BAR:
		return "|";
	case TOKEN_SEMI_COLON:
		return ";";
	case TOKEN_LEFT_PAREN:
		return "(";
	case TOKEN_RIGHT_PAREN:
		return ")";
	case TOKEN_LEFT_BRACKET:
		return "[";
	case TOKEN_RIGHT_BRACKET:
		return "]";
	case TOKEN_LEFT_BRACE:
		return "{";
	case TOKEN_RIGHT_BRACE:
		return "}";

	default:
		return "<unknown>";
	}
}